

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O1

void google::protobuf::compiler::java::WriteFieldStringBytesAccessorDocComment
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,bool builder)

{
  char *text;
  string local_88;
  string local_68;
  string local_48;
  
  io::Printer::Print<>(printer,"/**\n");
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  FieldDescriptor::DebugString_abi_cxx11_(&local_48,field);
  FirstLineOf(&local_88,&local_48);
  EscapeJavadoc(&local_68,&local_88);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer," * <code>$def$</code>\n",(char (*) [4])0x3ebae1,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  WriteDeprecatedJavadoc(printer,field,type);
  switch(type) {
  case GETTER:
    text = " * @return The bytes for $name$.\n";
    break;
  case SETTER:
    text = " * @param value The bytes for $name$ to set.\n";
    break;
  default:
    goto switchD_002eed95_caseD_3;
  case LIST_GETTER:
    text = " * @return A list containing the bytes for $name$.\n";
    break;
  case LIST_INDEXED_GETTER:
    io::Printer::Print<>(printer," * @param index The index of the value to return.\n");
    text = " * @return The bytes of the $name$ at the given index.\n";
    break;
  case LIST_INDEXED_SETTER:
    io::Printer::Print<>(printer," * @param index The index to set the value at.\n");
    text = " * @param value The bytes of the $name$ to set.\n";
    break;
  case LIST_ADDER:
    text = " * @param value The bytes of the $name$ to add.\n";
    break;
  case LIST_MULTI_ADDER:
    text = " * @param values The bytes of the $name$ to add.\n";
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,text,(char (*) [5])0x3f58c9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8)));
switchD_002eed95_caseD_3:
  if (builder) {
    io::Printer::Print<>(printer," * @return This builder for chaining.\n");
  }
  io::Printer::Print<>(printer," */\n");
  return;
}

Assistant:

void WriteFieldStringBytesAccessorDocComment(io::Printer* printer,
                                             const FieldDescriptor* field,
                                             const FieldAccessorType type,
                                             const bool builder) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field);
  printer->Print(" * <code>$def$</code>\n", "def",
                 EscapeJavadoc(FirstLineOf(field->DebugString())));
  WriteDeprecatedJavadoc(printer, field, type);
  switch (type) {
    case HAZZER:
      // Should never happen
      break;
    case GETTER:
      printer->Print(" * @return The bytes for $name$.\n", "name",
                     field->camelcase_name());
      break;
    case SETTER:
      printer->Print(" * @param value The bytes for $name$ to set.\n", "name",
                     field->camelcase_name());
      break;
    case CLEARER:
      // Print nothing
      break;
    // Repeated
    case LIST_COUNT:
      // Should never happen
      break;
    case LIST_GETTER:
      printer->Print(" * @return A list containing the bytes for $name$.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_GETTER:
      printer->Print(" * @param index The index of the value to return.\n");
      printer->Print(" * @return The bytes of the $name$ at the given index.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_SETTER:
      printer->Print(" * @param index The index to set the value at.\n");
      printer->Print(" * @param value The bytes of the $name$ to set.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_ADDER:
      printer->Print(" * @param value The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_MULTI_ADDER:
      printer->Print(" * @param values The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
  }
  if (builder) {
    printer->Print(" * @return This builder for chaining.\n");
  }
  printer->Print(" */\n");
}